

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_mttr(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx,int rd,int rt,int u,int sel,
             int h)

{
  TCGContext_conflict6 *s;
  uintptr_t o_1;
  TCGTemp *pTVar1;
  TCGv_i32 pTVar2;
  TCGv_i32 pTVar3;
  TCGv_i64 a2;
  TCGv_i32 fp0;
  TCGOpcode opc;
  int32_t iVar4;
  code *pcVar5;
  uintptr_t o;
  TCGv_i64 arg;
  TCGTemp *local_58;
  TCGv_i64 local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  int local_34;
  
  local_34 = h;
  s = ctx->uc->tcg_ctx;
  iVar4 = env->CP0_VPEControl;
  pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,true);
  arg = (TCGv_i64)((long)pTVar1 - (long)s);
  if (rt == 0) {
    opc = INDEX_op_movi_i64;
    a2 = (TCGv_i64)0x0;
LAB_0098d449:
    tcg_gen_op2_mips64el(s,opc,(TCGArg)pTVar1,(TCGArg)a2);
  }
  else if (s->cpu_gpr[rt] != arg) {
    a2 = s->cpu_gpr[rt] + (long)s;
    opc = INDEX_op_mov_i64;
    goto LAB_0098d449;
  }
  if ((((env->CP0_VPEConf0 & 2) == 0) &&
      ((((env->active_tc).CP0_TCBind ^ env->tcs[(byte)iVar4].CP0_TCBind) & 0xfU) != 0)) ||
     ((byte)env->mvp->CP0_MVPConf0 < (byte)env->CP0_VPEControl)) goto LAB_0098da8e;
  if (u == 0) {
    switch(rd) {
    case 1:
      if (sel == 2) {
        local_58 = (TCGTemp *)(s->cpu_env + (long)s);
        pcVar5 = helper_mttc0_vpeconf0_mips64el;
      }
      else {
        if (sel != 1) goto switchD_0098d4b4_default;
        local_58 = (TCGTemp *)(s->cpu_env + (long)s);
        pcVar5 = helper_mttc0_vpecontrol_mips64el;
      }
      break;
    case 2:
      switch(sel) {
      case 1:
        local_58 = (TCGTemp *)(s->cpu_env + (long)s);
        pcVar5 = helper_mttc0_tcstatus_mips64el;
        break;
      case 2:
        local_58 = (TCGTemp *)(s->cpu_env + (long)s);
        pcVar5 = helper_mttc0_tcbind_mips64el;
        break;
      case 3:
        local_58 = (TCGTemp *)(s->cpu_env + (long)s);
        pcVar5 = helper_mttc0_tcrestart_mips64el;
        break;
      case 4:
        local_58 = (TCGTemp *)(s->cpu_env + (long)s);
        pcVar5 = helper_mttc0_tchalt_mips64el;
        break;
      case 5:
        local_58 = (TCGTemp *)(s->cpu_env + (long)s);
        pcVar5 = helper_mttc0_tccontext_mips64el;
        break;
      case 6:
        local_58 = (TCGTemp *)(s->cpu_env + (long)s);
        pcVar5 = helper_mttc0_tcschedule_mips64el;
        break;
      case 7:
        local_58 = (TCGTemp *)(s->cpu_env + (long)s);
        pcVar5 = helper_mttc0_tcschefback_mips64el;
        break;
      default:
        rd = 2;
        goto LAB_0098d6e1;
      }
      break;
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 0xb:
    case 0xe:
switchD_0098d510_caseD_3:
LAB_0098d6e1:
      gen_mtc0(ctx,arg,rd,sel);
      goto LAB_0098da8e;
    case 10:
      if (sel != 0) {
        rd = 10;
        goto LAB_0098d6e1;
      }
      local_58 = (TCGTemp *)(s->cpu_env + (long)s);
      pcVar5 = helper_mttc0_entryhi_mips64el;
      break;
    case 0xc:
      if (sel != 0) {
        rd = 0xc;
        goto LAB_0098d6e1;
      }
      local_58 = (TCGTemp *)(s->cpu_env + (long)s);
      pcVar5 = helper_mttc0_status_mips64el;
      break;
    case 0xd:
      if (sel != 0) goto switchD_0098d4b4_default;
      local_58 = (TCGTemp *)(s->cpu_env + (long)s);
      pcVar5 = helper_mttc0_cause_mips64el;
      break;
    case 0xf:
      if (sel != 1) goto switchD_0098d4b4_default;
      local_58 = (TCGTemp *)(s->cpu_env + (long)s);
      pcVar5 = helper_mttc0_ebase_mips64el;
      break;
    default:
      if (rd != 0x17) goto switchD_0098d510_caseD_3;
      if (sel != 0) {
        rd = 0x17;
        goto LAB_0098d6e1;
      }
      local_58 = (TCGTemp *)(s->cpu_env + (long)s);
      pcVar5 = helper_mttc0_debug_mips64el;
    }
LAB_0098da7c:
    local_50 = (TCGv_i64)((long)s + (long)arg);
    tcg_gen_callN_mips64el(s,pcVar5,(TCGTemp *)0x0,2,&local_58);
    goto LAB_0098da8e;
  }
  switch(sel) {
  case 0:
    pTVar2 = tcg_const_i32_mips64el(s,rd);
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    local_48 = (TCGTemp *)(pTVar2 + (long)s);
    pcVar5 = helper_mttgpr_mips64el;
    goto LAB_0098d96f;
  case 1:
    break;
  case 2:
    pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    pTVar2 = (TCGv_i32)((long)pTVar1 - (long)s);
    tcg_gen_extrl_i64_i32_mips64el(s,pTVar2,arg);
    if (local_34 == 0) {
      gen_store_fpr32((DisasContext_conflict6 *)(ulong)ctx->hflags,(TCGv_i32)ctx->uc->tcg_ctx,
                      (int)pTVar2);
    }
    else {
      gen_store_fpr32h(ctx,pTVar2,rd);
    }
    pTVar1 = (TCGTemp *)(pTVar2 + (long)s);
    goto LAB_0098d97e;
  case 3:
    pTVar2 = tcg_const_i32_mips64el(s,rd);
    pTVar3 = tcg_const_i32_mips64el(s,rt);
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    local_50 = (TCGv_i64)((long)s + (long)arg);
    local_48 = (TCGTemp *)(pTVar2 + (long)s);
    local_40 = (TCGTemp *)(pTVar3 + (long)s);
    tcg_gen_callN_mips64el(s,helper_ctc1_mips64el,(TCGTemp *)0x0,4,&local_58);
    tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar3 + (long)s));
    tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar2 + (long)s));
    (ctx->base).is_jmp = DISAS_TARGET_0;
    goto LAB_0098da8e;
  default:
switchD_0098d4b4_default:
    tcg_temp_free_internal_mips64el(s,(TCGTemp *)(arg + (long)s));
    generate_exception_err(ctx,0x14,0);
    return;
  }
  switch(rd) {
  case 0:
    iVar4 = 0;
    break;
  case 1:
    iVar4 = 0;
    goto LAB_0098d8d1;
  case 2:
    iVar4 = 0;
    goto LAB_0098d941;
  default:
    goto switchD_0098d4b4_default;
  case 4:
    iVar4 = 1;
    break;
  case 5:
    iVar4 = 1;
    goto LAB_0098d8d1;
  case 6:
    iVar4 = 1;
    goto LAB_0098d941;
  case 8:
    iVar4 = 2;
    break;
  case 9:
    iVar4 = 2;
    goto LAB_0098d8d1;
  case 10:
    iVar4 = 2;
    goto LAB_0098d941;
  case 0xc:
    iVar4 = 3;
    break;
  case 0xd:
    iVar4 = 3;
LAB_0098d8d1:
    pTVar2 = tcg_const_i32_mips64el(s,iVar4);
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    local_48 = (TCGTemp *)(pTVar2 + (long)s);
    pcVar5 = helper_mtthi_mips64el;
    goto LAB_0098d96f;
  case 0xe:
    iVar4 = 3;
LAB_0098d941:
    pTVar2 = tcg_const_i32_mips64el(s,iVar4);
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    local_48 = (TCGTemp *)(pTVar2 + (long)s);
    pcVar5 = helper_mttacx_mips64el;
    goto LAB_0098d96f;
  case 0x10:
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    pcVar5 = helper_mttdsp_mips64el;
    goto LAB_0098da7c;
  }
  pTVar2 = tcg_const_i32_mips64el(s,iVar4);
  local_58 = (TCGTemp *)(s->cpu_env + (long)s);
  local_48 = (TCGTemp *)(pTVar2 + (long)s);
  pcVar5 = helper_mttlo_mips64el;
LAB_0098d96f:
  pTVar1 = local_48;
  local_50 = (TCGv_i64)((long)s + (long)arg);
  tcg_gen_callN_mips64el(s,pcVar5,(TCGTemp *)0x0,3,&local_58);
LAB_0098d97e:
  tcg_temp_free_internal_mips64el(s,pTVar1);
LAB_0098da8e:
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(arg + (long)s));
  return;
}

Assistant:

static void gen_mttr(CPUMIPSState *env, DisasContext *ctx, int rd, int rt,
                     int u, int sel, int h)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int other_tc = env->CP0_VPEControl & (0xff << CP0VPECo_TargTC);
    TCGv t0 = tcg_temp_local_new(tcg_ctx);

    gen_load_gpr(tcg_ctx, t0, rt);
    if ((env->CP0_VPEConf0 & (1 << CP0VPEC0_MVP)) == 0 &&
        ((env->tcs[other_tc].CP0_TCBind & (0xf << CP0TCBd_CurVPE)) !=
         (env->active_tc.CP0_TCBind & (0xf << CP0TCBd_CurVPE)))) {
        /* NOP */
        ;
    } else if ((env->CP0_VPEControl & (0xff << CP0VPECo_TargTC)) >
             (env->mvp->CP0_MVPConf0 & (0xff << CP0MVPC0_PTC))) {
        /* NOP */
        ;
    } else if (u == 0) {
        switch (rd) {
        case 1:
            switch (sel) {
            case 1:
                gen_helper_mttc0_vpecontrol(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            case 2:
                gen_helper_mttc0_vpeconf0(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            default:
                goto die;
                break;
            }
            break;
        case 2:
            switch (sel) {
            case 1:
                gen_helper_mttc0_tcstatus(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            case 2:
                gen_helper_mttc0_tcbind(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            case 3:
                gen_helper_mttc0_tcrestart(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            case 4:
                gen_helper_mttc0_tchalt(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            case 5:
                gen_helper_mttc0_tccontext(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            case 6:
                gen_helper_mttc0_tcschedule(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            case 7:
                gen_helper_mttc0_tcschefback(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            default:
                gen_mtc0(ctx, t0, rd, sel);
                break;
            }
            break;
        case 10:
            switch (sel) {
            case 0:
                gen_helper_mttc0_entryhi(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            default:
                gen_mtc0(ctx, t0, rd, sel);
                break;
            }
            break;
        case 12:
            switch (sel) {
            case 0:
                gen_helper_mttc0_status(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            default:
                gen_mtc0(ctx, t0, rd, sel);
                break;
            }
            break;
        case 13:
            switch (sel) {
            case 0:
                gen_helper_mttc0_cause(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            default:
                goto die;
                break;
            }
            break;
        case 15:
            switch (sel) {
            case 1:
                gen_helper_mttc0_ebase(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            default:
                goto die;
                break;
            }
            break;
        case 23:
            switch (sel) {
            case 0:
                gen_helper_mttc0_debug(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            default:
                gen_mtc0(ctx, t0, rd, sel);
                break;
            }
            break;
        default:
            gen_mtc0(ctx, t0, rd, sel);
        }
    } else {
        switch (sel) {
        /* GPR registers. */
        case 0:
            gen_helper_0e1i(mttgpr, t0, rd);
            break;
        /* Auxiliary CPU registers */
        case 1:
            switch (rd) {
            case 0:
                gen_helper_0e1i(mttlo, t0, 0);
                break;
            case 1:
                gen_helper_0e1i(mtthi, t0, 0);
                break;
            case 2:
                gen_helper_0e1i(mttacx, t0, 0);
                break;
            case 4:
                gen_helper_0e1i(mttlo, t0, 1);
                break;
            case 5:
                gen_helper_0e1i(mtthi, t0, 1);
                break;
            case 6:
                gen_helper_0e1i(mttacx, t0, 1);
                break;
            case 8:
                gen_helper_0e1i(mttlo, t0, 2);
                break;
            case 9:
                gen_helper_0e1i(mtthi, t0, 2);
                break;
            case 10:
                gen_helper_0e1i(mttacx, t0, 2);
                break;
            case 12:
                gen_helper_0e1i(mttlo, t0, 3);
                break;
            case 13:
                gen_helper_0e1i(mtthi, t0, 3);
                break;
            case 14:
                gen_helper_0e1i(mttacx, t0, 3);
                break;
            case 16:
                gen_helper_mttdsp(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            default:
                goto die;
            }
            break;
        /* Floating point (COP1). */
        case 2:
            /* XXX: For now we support only a single FPU context. */
            if (h == 0) {
                TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);

                tcg_gen_trunc_tl_i32(tcg_ctx, fp0, t0);
                gen_store_fpr32(ctx, fp0, rd);
                tcg_temp_free_i32(tcg_ctx, fp0);
            } else {
                TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);

                tcg_gen_trunc_tl_i32(tcg_ctx, fp0, t0);
                gen_store_fpr32h(ctx, fp0, rd);
                tcg_temp_free_i32(tcg_ctx, fp0);
            }
            break;
        case 3:
            /* XXX: For now we support only a single FPU context. */
            {
                TCGv_i32 fs_tmp = tcg_const_i32(tcg_ctx, rd);

                gen_helper_0e2i(ctc1, t0, fs_tmp, rt);
                tcg_temp_free_i32(tcg_ctx, fs_tmp);
            }
            /* Stop translation as we may have changed hflags */
            ctx->base.is_jmp = DISAS_STOP;
            break;
        /* COP2: Not implemented. */
        case 4:
        case 5:
            /* fall through */
        default:
            goto die;
        }
    }
    tcg_temp_free(tcg_ctx, t0);
    return;

die:
    tcg_temp_free(tcg_ctx, t0);
    LOG_DISAS("mttr (reg %d u %d sel %d h %d)\n", rd, u, sel, h);
    generate_exception_end(ctx, EXCP_RI);
}